

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O1

void png_warning(png_const_structrp png_ptr,png_const_charp warning_message)

{
  ulong uVar1;
  
  if ((png_ptr == (png_const_structrp)0x0) || (*warning_message != '#')) {
    uVar1 = 0;
  }
  else {
    uVar1 = 1;
    do {
      if (warning_message[uVar1] == ' ') goto LAB_001095db;
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0xf);
    uVar1 = 0xf;
LAB_001095db:
    uVar1 = uVar1 & 0xffffffff;
  }
  if ((png_ptr != (png_const_structrp)0x0) && (png_ptr->warning_fn != (png_error_ptr)0x0)) {
    (*png_ptr->warning_fn)(png_ptr,warning_message + uVar1);
    return;
  }
  png_warning_cold_1();
  return;
}

Assistant:

void PNGAPI
png_warning(png_const_structrp png_ptr, png_const_charp warning_message)
{
   int offset = 0;
   if (png_ptr != NULL)
   {
#ifdef PNG_ERROR_NUMBERS_SUPPORTED
   if ((png_ptr->flags &
       (PNG_FLAG_STRIP_ERROR_NUMBERS|PNG_FLAG_STRIP_ERROR_TEXT)) != 0)
#endif
      {
         if (*warning_message == PNG_LITERAL_SHARP)
         {
            for (offset = 1; offset < 15; offset++)
               if (warning_message[offset] == ' ')
                  break;
         }
      }
   }
   if (png_ptr != NULL && png_ptr->warning_fn != NULL)
      (*(png_ptr->warning_fn))(png_constcast(png_structrp,png_ptr),
          warning_message + offset);
   else
      png_default_warning(png_ptr, warning_message + offset);
}